

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

effect_object_property * effect_summarize_properties(effect *ef,int *unsummarized_count)

{
  _Bool _Var1;
  ushort uVar2;
  effect *peVar3;
  effect *peVar4;
  uint uVar5;
  int iVar6;
  effect_object_property *peVar7;
  ulong uVar8;
  effect_object_property *peVar9;
  timed_failure *ptVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  dice_t *pdVar13;
  wchar_t wVar14;
  effect_object_property_kind eVar15;
  bool bVar16;
  int unsummarized;
  effect_object_property *local_58;
  int local_4c;
  dice_t *local_48;
  int *local_40;
  effect *local_38;
  
  local_4c = 0;
  local_58 = (effect_object_property *)0x0;
  local_40 = unsummarized_count;
  if (ef != (effect *)0x0) {
    local_48 = (dice_t *)0x0;
    do {
      uVar2 = ef->index;
      uVar5 = (uint)uVar2;
      if (uVar2 < 0x3b) {
        switch(uVar5) {
        case 1:
          break;
        default:
switchD_00144deb_caseD_2:
          local_4c = local_4c + 1;
          break;
        case 8:
          wVar12 = ef->subtype;
          if ((uint)wVar12 < 0x35) {
LAB_00144ec5:
            summarize_cure(wVar12,&local_58,&local_4c);
          }
          break;
        case 9:
          pdVar13 = local_48;
          if ((((local_48 == (dice_t *)0x0) && (pdVar13 = ef->dice, pdVar13 == (dice_t *)0x0)) ||
              (iVar6 = dice_evaluate(pdVar13,0,MAXIMISE,(random_value *)0x0), iVar6 < 1)) &&
             (wVar12 = ef->subtype, (uint)wVar12 < 0x35)) goto LAB_00144ec5;
        case 10:
        case 0xb:
          pdVar13 = local_48;
          if (((local_48 != (dice_t *)0x0) || (pdVar13 = ef->dice, pdVar13 != (dice_t *)0x0)) &&
             ((iVar6 = dice_evaluate(pdVar13,0,MAXIMISE,(random_value *)0x0), 0 < iVar6 &&
              (uVar8 = (ulong)(uint)ef->subtype, uVar8 < 0x35)))) {
            wVar12 = timed_effects[uVar8].oflag_dup;
            bVar16 = wVar12 != L'\0';
            if (bVar16) {
              _Var1 = timed_effects[uVar8].oflag_syn;
              peVar7 = (effect_object_property *)mem_alloc(0x18);
              peVar7->next = local_58;
              peVar7->idx = wVar12;
              peVar7->reslevel_min = L'\0';
              peVar7->reslevel_max = L'\0';
              peVar7->kind = _Var1 ^ EFPROP_OBJECT_FLAG;
              local_58 = peVar7;
            }
            wVar12 = ef->subtype;
            if (-1 < timed_effects[wVar12].temp_resist) {
              ptVar10 = timed_effects[wVar12].fail;
              if (ptVar10 == (timed_failure *)0x0) {
                wVar11 = L'È';
                wVar14 = L'\n';
              }
              else {
                wVar14 = L'\n';
                wVar11 = L'È';
                do {
                  if (ptVar10->idx == timed_effects[wVar12].temp_resist) {
                    if (ptVar10->code == 3) {
                      wVar11 = L'd';
                    }
                    else if (ptVar10->code == 2) {
                      wVar14 = L'Q';
                    }
                  }
                  ptVar10 = ptVar10->next;
                } while (ptVar10 != (timed_failure *)0x0);
              }
              wVar12 = timed_effects[wVar12].temp_resist;
              peVar7 = (effect_object_property *)mem_alloc(0x18);
              peVar7->next = local_58;
              peVar7->idx = wVar12;
              peVar7->reslevel_min = wVar14;
              peVar7->reslevel_max = wVar11;
              peVar7->kind = EFPROP_RESIST;
              bVar16 = true;
              local_58 = peVar7;
            }
            peVar4 = ef;
            peVar7 = local_58;
            peVar3 = local_38;
            for (ptVar10 = timed_effects[ef->subtype].fail; local_38 = peVar4,
                ptVar10 != (timed_failure *)0x0; ptVar10 = ptVar10->next) {
              iVar6 = ptVar10->code;
              if (iVar6 == 3) {
                wVar12 = ptVar10->idx;
                if (wVar12 != timed_effects[ef->subtype].temp_resist) {
                  eVar15 = EFPROP_CONFLICT_VULN;
                  wVar14 = L'd';
                  wVar11 = L'\0';
                  goto LAB_00145090;
                }
              }
              else if (iVar6 == 2) {
                wVar12 = ptVar10->idx;
                if (wVar12 != timed_effects[ef->subtype].temp_resist) {
                  eVar15 = EFPROP_CONFLICT_RESIST;
                  wVar14 = L'È';
                  wVar11 = L'Q';
                  goto LAB_00145090;
                }
              }
              else if (iVar6 == 1) {
                wVar12 = ptVar10->idx;
                eVar15 = EFPROP_CONFLICT_FLAG;
                wVar11 = L'\0';
                wVar14 = L'\0';
LAB_00145090:
                peVar9 = (effect_object_property *)mem_alloc(0x18);
                peVar9->next = peVar7;
                peVar9->idx = wVar12;
                peVar9->reslevel_min = wVar11;
                peVar9->reslevel_max = wVar14;
                peVar9->kind = eVar15;
                bVar16 = true;
                peVar7 = peVar9;
                ef = local_38;
              }
              peVar4 = local_38;
              peVar3 = local_38;
            }
            wVar12 = timed_effects[ef->subtype].temp_brand;
            local_58 = peVar7;
            local_38 = peVar3;
            if (L'\xffffffff' < wVar12) {
              peVar7 = (effect_object_property *)mem_alloc(0x18);
              peVar7->next = local_58;
              peVar7->idx = wVar12;
              peVar7->reslevel_min = L'\0';
              peVar7->reslevel_max = L'\0';
              peVar7->kind = EFPROP_BRAND;
              bVar16 = true;
              local_58 = peVar7;
            }
            wVar12 = timed_effects[ef->subtype].temp_slay;
            if (L'\xffffffff' < wVar12) {
              peVar7 = (effect_object_property *)mem_alloc(0x18);
              peVar7->next = local_58;
              peVar7->idx = wVar12;
              peVar7->reslevel_min = L'\0';
              peVar7->reslevel_max = L'\0';
              peVar7->kind = EFPROP_SLAY;
              bVar16 = true;
              local_58 = peVar7;
            }
            if (!bVar16) {
              local_4c = local_4c + 1;
            }
          }
          break;
        case 0xd:
          pdVar13 = local_48;
          if (((local_48 != (dice_t *)0x0) || (pdVar13 = ef->dice, pdVar13 != (dice_t *)0x0)) &&
             (iVar6 = dice_evaluate(pdVar13,0,MAXIMISE,(random_value *)0x0), 0 < iVar6)) {
            wVar12 = ef->subtype;
            goto LAB_00144ec5;
          }
        }
      }
      else if (uVar2 < 0x7a) {
        if (2 < uVar5 - 0x3b) goto switchD_00144deb_caseD_2;
        peVar7 = (effect_object_property *)mem_alloc(0x18);
        peVar7->next = local_58;
        peVar7->idx = L'\x1d';
        peVar7->reslevel_min = L'\0';
        peVar7->reslevel_max = L'\0';
        peVar7->kind = EFPROP_CONFLICT_FLAG;
        local_58 = peVar7;
      }
      else if (uVar5 != 0x7a) {
        if (uVar5 == 0x7c) {
          local_48 = (dice_t *)0x0;
        }
        else {
          if (uVar5 != 0x7b) goto switchD_00144deb_caseD_2;
          local_48 = ef->dice;
        }
      }
      ef = ef->next;
    } while (ef != (effect *)0x0);
  }
  if (local_40 != (int *)0x0) {
    *local_40 = local_4c;
  }
  return local_58;
}

Assistant:

struct effect_object_property *effect_summarize_properties(
		const struct effect *ef, int *unsummarized_count)
{
	int unsummarized = 0;
	struct effect_object_property *summaries = NULL;
	dice_t *remembered_dice = NULL;

	for (; ef; ef = ef->next) {
		int value_this;

		switch (ef->index) {
		case EF_RANDOM:
		case EF_SELECT:
			/*
			 * For random or select effects, summarize all of the
			 * subeffects since any of them is possible.  That's
			 * equivalent to simply skipping over the random or
			 * select effect and stepping one by one through what
			 * follows.
			 */
			break;

		case EF_SET_VALUE:
			/*
			 * Remember the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = ef->dice;
			break;

		case EF_CLEAR_VALUE:
			/*
			 * Forget the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = NULL;
			break;

		case EF_CURE:
			if (ef->subtype >= 0 && ef->subtype < TMD_MAX) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TIMED_SET:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this <= 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				/* It's equivalent to a cure. */
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
				break;
			}
			/* Fall through. */

		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this > 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				bool summarized = false;
				const struct timed_failure *f;

				if (timed_effects[ef->subtype].oflag_dup !=
						OF_NONE) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].oflag_dup,
						0, 0,
						timed_effects[ef->subtype].oflag_syn ?
						EFPROP_OBJECT_FLAG_EXACT : EFPROP_OBJECT_FLAG);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_resist >= 0) {
					/*
					 * At RES_LEVEL_BASE, the benefit from
					 * RES_BOOST_NORMAL is a drop of 40
					 * in the resistance level.  When the
					 * benefit drops to less than a 1/10th
					 * of that say that there's limited
					 * benefit.  That happens when the
					 * resistance level is less than 10.
					 */
					int rmin = 10, rmax = RES_LEVEL_MIN;

					f = timed_effects[ef->subtype].fail;
					while (f) {
						if (f->idx == timed_effects[ef->subtype].temp_resist) {
							if (f->code == TMD_FAIL_FLAG_RESIST) {
								rmin = MAX(rmin, RES_LEVEL_EFFECT + 1);
							} else if (f->code == TMD_FAIL_FLAG_VULN) {
								rmax = MIN(rmax, RES_LEVEL_BASE);
							}
						}
						f = f->next;
					}
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_resist,
						rmin, rmax, EFPROP_RESIST);
					summarized = true;
				}
				f = timed_effects[ef->subtype].fail;
				while (f) {
					switch (f->code) {
					case TMD_FAIL_FLAG_OBJECT:
						add_to_summaries(&summaries,
							f->idx, 0, 0,
							EFPROP_CONFLICT_FLAG);
						summarized = true;
						break;

					case TMD_FAIL_FLAG_RESIST:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_EFFECT + 1,
								RES_LEVEL_MIN,
								EFPROP_CONFLICT_RESIST);
							summarized = true;
						}
						break;

					case TMD_FAIL_FLAG_VULN:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_MAX,
								RES_LEVEL_BASE,
								EFPROP_CONFLICT_VULN);
							summarized = true;
						}
						break;

					default:
						/* Nothing special is needed. */
						break;
					}
					f = f->next;
				}
				if (timed_effects[ef->subtype].temp_brand >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_brand,
						0, 0, EFPROP_BRAND);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_slay >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_slay,
						0, 0, EFPROP_SLAY);
					summarized = true;
				}
				if (!summarized) ++unsummarized;
			}
			break;

		case EF_TIMED_DEC:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			/* If it decreases the duration, it's a partial cure. */
			if (value_this > 0) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TELEPORT:
		case EF_TELEPORT_TO:
		case EF_TELEPORT_LEVEL:
			add_to_summaries(&summaries, OF_NO_TELEPORT,
				0, 0, EFPROP_CONFLICT_FLAG);
			break;

		/*
		 * There's other effects that have limited utility when the
		 * object already has some flags:
		 * DISABLE_TRAPS with OF_TRAP_IMMUNE is only good for unlocking
		 * DETECT_INVISIBLE with OF_SEE_INVISIBLE or OF_TELEPATHY
		 * RESTORE_x with OF_SUST_x
		 * RESTORE_EXP with OF_HOLD_LIFE
		 * For now, don't try to flag those.
		 */
		default:
			/*
			 * Everything else isn't related to an object property.
			 */
			++unsummarized;
			break;
		}
	}

	if (unsummarized_count) *unsummarized_count = unsummarized;
	return summaries;
}